

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H1V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  int iVar6;
  int iVar7;
  int j;
  long lVar8;
  int iVar9;
  
  puVar5 = this->m_pScan_line_0;
  puVar4 = this->m_pSample_buf + ((long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left) * 8;
  for (iVar6 = this->m_max_mcus_per_row; 0 < iVar6; iVar6 = iVar6 + -1) {
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      bVar1 = puVar4[lVar8];
      bVar2 = puVar4[lVar8 + 0x80];
      iVar7 = this->m_crr[bVar2] + (uint)bVar1;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      bVar3 = puVar4[lVar8 + 0x40];
      *puVar5 = (uint8)iVar7;
      iVar7 = (this->m_cbg[bVar3] + this->m_crg[bVar2] >> 0x10) + (uint)bVar1;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      puVar5[1] = (uint8)iVar7;
      iVar9 = (uint)bVar1 + this->m_cbb[bVar3];
      iVar7 = 0;
      if (0 < iVar9) {
        iVar7 = iVar9;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      puVar5[2] = (uint8)iVar7;
      puVar5[3] = 0xff;
      puVar5 = puVar5 + 4;
    }
    puVar4 = puVar4 + 0xc0;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d = m_pScan_line_0;
		uint8* s = m_pSample_buf + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int y = s[j];
				int cb = s[64 + j];
				int cr = s[128 + j];

				d[0] = clamp(y + m_crr[cr]);
				d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
				d[2] = clamp(y + m_cbb[cb]);
				d[3] = 255;

				d += 4;
			}

			s += 64 * 3;
		}
	}